

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

uint fmt::internal::parse_nonnegative_int<char>(char **s)

{
  bool bVar1;
  FormatError *this;
  CStringRef local_28;
  uint local_1c;
  uint local_18;
  uint big;
  uint max_int;
  uint value;
  char **s_local;
  
  bVar1 = false;
  if ('/' < **s) {
    bVar1 = **s < ':';
  }
  _max_int = s;
  if (!bVar1) {
    __assert_fail("\'0\' <= *s && *s <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/octobanana[P]pine/src/format.h"
                  ,0xeb0,
                  "unsigned int fmt::internal::parse_nonnegative_int(const Char *&) [Char = char]");
  }
  big = 0;
  local_18 = std::numeric_limits<int>::max();
  local_1c = local_18 / 10;
  do {
    if (local_1c < big) {
      big = local_18 + 1;
      break;
    }
    big = big * 10 + **_max_int + -0x30;
    *_max_int = *_max_int + 1;
    bVar1 = false;
    if ('/' < **_max_int) {
      bVar1 = **_max_int < ':';
    }
  } while (bVar1);
  if (local_18 < big) {
    this = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_28,"number is too big");
    FormatError::FormatError(this,local_28);
    __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return big;
}

Assistant:

unsigned parse_nonnegative_int(const Char *&s) {
  assert('0' <= *s && *s <= '9');
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  unsigned max_int = (std::numeric_limits<int>::max)();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + (*s - '0');
    ++s;
  } while ('0' <= *s && *s <= '9');
  // Convert to unsigned to prevent a warning.
  if (value > max_int)
    FMT_THROW(FormatError("number is too big"));
  return value;
}